

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O2

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBoxDoIt
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId fabarrayid,Box *destFabBox,
          BoxList *returnedUnfilledBoxes,int faindex,int srccomp,int destcomp,int numcomp,
          bool bUseValidBox,BoxDomain *unfilledBoxDomain)

{
  int iVar1;
  FabArray<amrex::FArrayBox> *this_00;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  FabCopyDescriptor<amrex::FArrayBox> *this_01;
  FArrayBox *pFVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  Box intersect;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158 [2];
  int iStack_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  IndexType IStack_140;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = *(int *)(ParallelContext::frames + 0xc);
  this_00 = (this->fabArrays).
            super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[fabarrayid.fabArrayId];
  intersect.smallend.vect._0_8_ = *(undefined8 *)(destFabBox->smallend).vect;
  uVar3 = *(undefined8 *)((destFabBox->smallend).vect + 2);
  intersect._20_8_ = *(undefined8 *)((destFabBox->bigend).vect + 2);
  intersect.bigend.vect[1] = (int)((ulong)*(undefined8 *)(destFabBox->bigend).vect >> 0x20);
  intersect.smallend.vect[2] = (int)uVar3;
  intersect.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  if (bUseValidBox) {
    BoxArray::operator[]((Box *)local_188,&(this_00->super_FabArrayBase).boxarray,faindex);
  }
  else {
    FabArrayBase::fabbox((Box *)local_188,&this_00->super_FabArrayBase,faindex);
  }
  iVar6 = local_188._0_4_;
  if ((int)local_188._0_4_ < intersect.smallend.vect[0]) {
    iVar6 = intersect.smallend.vect[0];
  }
  iVar4 = local_188._4_4_;
  if ((int)local_188._4_4_ < intersect.smallend.vect[1]) {
    iVar4 = intersect.smallend.vect[1];
  }
  intersect.smallend.vect[1] = iVar4;
  intersect.smallend.vect[0] = iVar6;
  iVar7 = (int)uStack_180;
  if ((int)uStack_180 < intersect.smallend.vect[2]) {
    iVar7 = intersect.smallend.vect[2];
  }
  if (intersect.bigend.vect[0] < uStack_180._4_4_) {
    uStack_180._4_4_ = intersect.bigend.vect[0];
  }
  uVar8 = local_178._M_allocated_capacity._0_4_;
  if (intersect.bigend.vect[1] < (int)local_178._M_allocated_capacity._0_4_) {
    uVar8 = intersect.bigend.vect[1];
  }
  uVar2 = local_178._M_allocated_capacity._4_4_;
  if (intersect.bigend.vect[2] < (int)local_178._M_allocated_capacity._4_4_) {
    uVar2 = intersect.bigend.vect[2];
  }
  intersect.bigend.vect[2] = uVar2;
  if ((((iVar6 <= uStack_180._4_4_) && (iVar4 <= (int)uVar8)) && (iVar7 <= (int)uVar2)) &&
     (intersect.btype.itype < 8)) {
    intersect.smallend.vect[2] = iVar7;
    intersect.bigend.vect[0] = uStack_180._4_4_;
    intersect.bigend.vect[1] = uVar8;
    this_01 = (FabCopyDescriptor<amrex::FArrayBox> *)operator_new(0x48);
    FabCopyDescriptor<amrex::FArrayBox>::FabCopyDescriptor(this_01);
    iVar6 = *(int *)(*(long *)&(((this_00->super_FabArrayBase).distributionMap.m_ref.
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    (long)faindex * 4);
    if (*(int *)(ParallelContext::frames + 0x10) <= iVar6) {
      std::__cxx11::to_string(&local_f0,*(int *)(ParallelContext::frames + 0xc));
      std::operator+(&local_d0,"Bad remoteProc: ",&local_f0);
      std::operator+(&local_b0,&local_d0,":: _in AddBoxDoIt:  nProcs remoteProc = ");
      std::__cxx11::to_string(&local_110,*(int *)(ParallelContext::frames + 0x10));
      std::operator+(&local_90,&local_b0,&local_110);
      std::operator+(&local_70,&local_90,"  ");
      std::__cxx11::to_string(&local_130,iVar6);
      std::operator+(&local_50,&local_70,&local_130);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     &local_50,"\n");
      Abort((string *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    this_01->fillBoxId = this->nextFillBoxId;
    *(undefined8 *)(this_01->subBox).smallend.vect = intersect.smallend.vect._0_8_;
    *(ulong *)((this_01->subBox).smallend.vect + 2) =
         CONCAT44(intersect.bigend.vect[0],intersect.smallend.vect[2]);
    *(ulong *)(this_01->subBox).bigend.vect =
         CONCAT44(intersect.bigend.vect[1],intersect.bigend.vect[0]);
    *(undefined8 *)((this_01->subBox).bigend.vect + 2) = intersect._20_8_;
    this_01->myProc = iVar1;
    this_01->copyFromProc = iVar6;
    this_01->copyFromIndex = faindex;
    this_01->srcComp = srccomp;
    this_01->destComp = destcomp;
    this_01->nComp = numcomp;
    if (iVar6 < 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = iVar6 - iVar6 % (int)ParallelDescriptor::m_Team._4_4_;
    }
    if (ParallelDescriptor::m_Team._12_4_ == iVar4) {
      this_01->fillType = FillLocally;
      pFVar5 = FabArray<amrex::FArrayBox>::fabPtr(this_00,faindex);
      this_01->localFabSource = pFVar5;
    }
    else {
      local_178._M_allocated_capacity = 0;
      local_178._8_8_ = 0;
      local_188 = (undefined1  [8])0x0;
      uStack_180 = (FabCopyDescriptor<amrex::FArrayBox> *)0x0;
      this->dataAvailable = false;
      this_01->fillType = FillRemotely;
      pFVar5 = (FArrayBox *)operator_new(0x48);
      FArrayBox::FArrayBox(pFVar5,&intersect,numcomp,true,false,(Arena *)0x0);
      this_01->localFabSource = pFVar5;
      this_01->cacheDataAllocated = true;
      local_164 = this->nextFillBoxId;
      uStack_180 = (FabCopyDescriptor<amrex::FArrayBox> *)CONCAT44(uStack_180._4_4_,faindex);
      local_158[0] = intersect.smallend.vect[0];
      local_158[1] = intersect.smallend.vect[1];
      iStack_150 = intersect.smallend.vect[2];
      iStack_14c = intersect.bigend.vect[0];
      iStack_148 = intersect.bigend.vect[1];
      iStack_144 = intersect.bigend.vect[2];
      IStack_140.itype = intersect.btype.itype;
      local_178._M_allocated_capacity._4_4_ = destcomp;
      local_178._M_allocated_capacity._0_4_ = srccomp;
      local_178._8_4_ = numcomp;
      local_168 = fabarrayid.fabArrayId;
      local_160 = iVar1;
      local_15c = iVar6;
      std::vector<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>::
      push_back(&this->fabComTagList,(value_type *)local_188);
    }
    local_188._0_4_ = this_01->fillBoxId;
    uStack_180 = this_01;
    std::
    _Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
    ::_M_insert_equal<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>
              ((_Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
                *)((this->fabCopyDescList).
                   super__Vector_base<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + fabarrayid.fabArrayId),
               (pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*> *)local_188);
    if (returnedUnfilledBoxes != (BoxList *)0x0) {
      BoxDomain::rmBox(unfilledBoxDomain,&intersect);
    }
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::AddBoxDoIt (FabArrayId fabarrayid,
                                         const Box& destFabBox,
                                         BoxList*   returnedUnfilledBoxes,
                                         int        faindex,
                                         int        srccomp,
                                         int        destcomp,
                                         int        numcomp,
                                         bool       bUseValidBox,
                                         BoxDomain& unfilledBoxDomain)
{
    const int myProc = ParallelDescriptor::MyProc();

    FabArray<FAB>* fabArray = fabArrays[fabarrayid.Id()];

    BL_ASSERT(faindex >= 0 && faindex < fabArray->size());

    Box intersect = destFabBox;

    if (bUseValidBox)
    {
        intersect &= fabArray->box(faindex);
    }
    else
    {
        intersect &= fabArray->fabbox(faindex);
    }

    if (intersect.ok())
    {
        FabCopyDescriptor<FAB>* fcd = new FabCopyDescriptor<FAB>;

        int remoteProc     = fabArray->DistributionMap()[faindex];
        if(remoteProc >= ParallelDescriptor::NProcs()) {
            amrex::Abort("Bad remoteProc: "
                         + std::to_string(ParallelDescriptor::MyProc())
                         + ":: _in AddBoxDoIt:  nProcs remoteProc = "
                         + std::to_string(ParallelDescriptor::NProcs())
                         + "  " + std::to_string(remoteProc) + "\n");
        }
        fcd->fillBoxId     = nextFillBoxId;
        fcd->subBox        = intersect;
        fcd->myProc        = myProc;
        fcd->copyFromProc  = remoteProc;
        fcd->copyFromIndex = faindex;
        fcd->srcComp       = srccomp;
        fcd->destComp      = destcomp;
        fcd->nComp         = numcomp;

        if (ParallelDescriptor::sameTeam(remoteProc))
        {
            //
            // Data is local.
            //
            fcd->fillType       = FillLocally;
            fcd->localFabSource = &(*fabArray)[faindex];
        }
        else
        {
            //
            // Data is remote.
            //
            FabArrayBase::FabComTag fabComTag;

            dataAvailable               = false;
            fcd->fillType               = FillRemotely;
            fcd->localFabSource         = new FAB(intersect, numcomp);
            fcd->cacheDataAllocated     = true;
            fabComTag.fabArrayId        = fabarrayid.Id();
            fabComTag.fillBoxId         = nextFillBoxId;
            fabComTag.fabIndex          = faindex;
            fabComTag.procThatNeedsData = myProc;
            fabComTag.procThatHasData   = remoteProc;
            fabComTag.box               = intersect;
            fabComTag.srcComp           = srccomp;
            fabComTag.destComp          = destcomp;
            fabComTag.nComp             = numcomp;
            //
            // Do not send the data yet.
            //
            fabComTagList.push_back(fabComTag);
        }

        fabCopyDescList[fabarrayid.Id()].insert(FCDMapValueType(fcd->fillBoxId,fcd));

        if (returnedUnfilledBoxes != 0)
        {
            unfilledBoxDomain.rmBox(intersect);
        }
    }
}